

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O0

BYTE * R_GetColumn(FTexture *tex,int col)

{
  int iVar1;
  undefined4 extraout_var;
  uint local_14;
  int width;
  int col_local;
  FTexture *tex_local;
  
  local_14 = col;
  if (col < 0) {
    iVar1 = FTexture::GetWidth(tex);
    if (iVar1 != 1 << (tex->WidthBits & 0x1f)) {
      local_14 = iVar1 + col % iVar1;
    }
  }
  iVar1 = (*tex->_vptr_FTexture[2])(tex,(ulong)local_14,0);
  return (BYTE *)CONCAT44(extraout_var,iVar1);
}

Assistant:

const BYTE *R_GetColumn (FTexture *tex, int col)
{
	int width;

	// If the texture's width isn't a power of 2, then we need to make it a
	// positive offset for proper clamping.
	if (col < 0 && (width = tex->GetWidth()) != (1 << tex->WidthBits))
	{
		col = width + (col % width);
	}
	return tex->GetColumn (col, NULL);
}